

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

LabelInstr * __thiscall
Lowerer::GenerateBailOut
          (Lowerer *this,Instr *instr,BranchInstr *branchInstr,LabelInstr *bailOutLabel,
          LabelInstr *collectRuntimeStatsLabel)

{
  int iVar1;
  uint polymorphicCacheIndexValue;
  uint bailOutCacheIndex;
  uint bailOutCacheIndex_00;
  BVSparse<Memory::JitArenaAllocator> *this_00;
  Instr *pIVar2;
  code *pcVar3;
  uint32 trueBailOutOffset;
  uint uVar4;
  IndirOpnd *dst;
  BranchInstr *pBVar5;
  bool bVar6;
  IRType type;
  IRKind IVar7;
  BailOutKind BVar8;
  BailOutKind BVar9;
  uint32 uVar10;
  RegSlot resultByteCodeReg;
  char16 *desc;
  size_t sVar11;
  IntConstOpnd *pIVar12;
  undefined4 *puVar13;
  Func *pFVar14;
  StackSym *pSVar15;
  RegOpnd *pRVar16;
  AddrOpnd *src;
  Opnd *pOVar17;
  Allocator *pAVar18;
  BranchBailOutRecord *pBVar19;
  HelperCallOpnd *newSrc;
  JITTimeFunctionBody *this_01;
  LabelInstr *pLVar20;
  BailOutInfo *local_2a8;
  bool local_1f1;
  bool local_1e1;
  BailOutInfo *local_1e0;
  TrackAllocData local_168;
  code *local_140;
  undefined8 local_138;
  TrackAllocData local_130;
  code *local_108;
  undefined8 local_100;
  TrackAllocData local_f8;
  Instr *local_d0;
  Instr *subInstr;
  Opnd *pOStack_c0;
  bool invertTarget;
  Opnd *condOpnd;
  uint32 falseOffset;
  uint32 trueOffset;
  LabelInstr *targetLabel;
  BranchBailOutRecord *pBStack_a0;
  JnHelperMethod helperMethod;
  BailOutRecord *bailOutRecord;
  BranchInstr *pBStack_90;
  BailOutKind bailOutKind;
  BranchInstr *newBranchInstr;
  LabelInstr *bailOutTargetLabel;
  Opnd *functionBodyOpnd;
  IndirOpnd *pIStack_70;
  int bailOutRecordOffset;
  Opnd *indexOpndForBailOutKind;
  BranchInstr *bailOutBranch;
  LabelInstr *bailOutLabelInstr;
  Instr *bailOutInstr;
  BailOutInfo *bailOutInfo;
  LabelInstr *collectRuntimeStatsLabel_local;
  LabelInstr *bailOutLabel_local;
  BranchInstr *branchInstr_local;
  Instr *instr_local;
  Lowerer *this_local;
  Instr *local_18;
  LabelInstr *local_10;
  
  bailOutInfo = (BailOutInfo *)collectRuntimeStatsLabel;
  collectRuntimeStatsLabel_local = bailOutLabel;
  bailOutLabel_local = (LabelInstr *)branchInstr;
  branchInstr_local = (BranchInstr *)instr;
  instr_local = (Instr *)this;
  bailOutInstr = (Instr *)IR::Instr::GetBailOutInfo(instr);
  bailOutLabelInstr = (LabelInstr *)((BailOutInfo *)bailOutInstr)->bailOutInstr;
  bVar6 = IR::Instr::IsCloned(&branchInstr_local->super_Instr);
  if (bVar6) {
    if (bailOutLabelInstr == (LabelInstr *)branchInstr_local) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar13 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x3761,"(bailOutInstr != instr)","bailOutInstr != instr");
      if (!bVar6) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar13 = 0;
    }
    bailOutBranch = (BranchInstr *)IR::Instr::AsLabelInstr(&bailOutLabelInstr->super_Instr);
    indexOpndForBailOutKind =
         (Opnd *)IR::BranchInstr::New(JMP,(LabelInstr *)bailOutBranch,this->m_func);
    IR::Instr::InsertBefore(&branchInstr_local->super_Instr,(Instr *)indexOpndForBailOutKind);
    IR::Instr::Remove(&branchInstr_local->super_Instr);
    return collectRuntimeStatsLabel_local;
  }
  if (bailOutInfo == (BailOutInfo *)0x0) {
    bailOutInfo = (BailOutInfo *)IR::LabelInstr::New(Label,this->m_func,true);
  }
  bVar6 = IR::Instr::IsLinked((Instr *)bailOutInfo);
  if (bVar6) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar13 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3770,"(!collectRuntimeStatsLabel->IsLinked())",
                       "!collectRuntimeStatsLabel->IsLinked()");
    if (!bVar6) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar13 = 0;
  }
  IR::Instr::InsertBefore(&branchInstr_local->super_Instr,(Instr *)bailOutInfo);
  pLVar20 = bailOutLabelInstr;
  if (bailOutLabelInstr != (LabelInstr *)branchInstr_local) {
    pIStack_70 = (IndirOpnd *)0x0;
    functionBodyOpnd._4_4_ = 0;
    bVar6 = Func::IsOOPJIT(this->m_func);
    if (bVar6) {
      functionBodyOpnd._4_4_ = NativeCodeData::GetDataTotalOffset(bailOutInstr->m_next);
      pFVar14 = Func::GetTopFunc(this->m_func);
      pSVar15 = Func::GetNativeCodeDataSym(pFVar14);
      pRVar16 = IR::RegOpnd::New(pSVar15,TyVar,this->m_func);
      uVar4 = functionBodyOpnd._4_4_;
      sVar11 = BailOutRecord::GetOffsetOfBailOutKind();
      desc = NativeCodeData::GetDataDescription(bailOutInstr->m_next,this->m_func->m_alloc);
      pIStack_70 = IR::IndirOpnd::New(pRVar16,uVar4 + (int)sVar11,TyUint32,desc,this->m_func,true);
      this_00 = this->addToLiveOnBackEdgeSyms;
      pFVar14 = Func::GetTopFunc(this->m_func);
      pSVar15 = Func::GetNativeCodeDataSym(pFVar14);
      BVSparse<Memory::JitArenaAllocator>::Set(this_00,(pSVar15->super_Sym).m_id);
    }
    else {
      pIVar2 = bailOutInstr->m_next;
      sVar11 = BailOutRecord::GetOffsetOfBailOutKind();
      pIStack_70 = (IndirOpnd *)
                   IR::MemRefOpnd::New((void *)((long)&pIVar2->_vptr_Instr + sVar11),TyUint32,
                                       this->m_func,AddrOpndKindDynamicBailOutKindRef);
    }
    dst = pIStack_70;
    BVar8 = IR::Instr::GetBailOutKind(&branchInstr_local->super_Instr);
    type = IR::Opnd::GetType(&pIStack_70->super_Opnd);
    pIVar12 = IR::IntConstOpnd::New((ulong)BVar8,type,this->m_func,false);
    InsertMove(&dst->super_Opnd,&pIVar12->super_Opnd,&branchInstr_local->super_Instr,false);
    BVar8 = IR::Instr::GetBailOutKind(&branchInstr_local->super_Instr);
    if ((BVar8 == BailOutFailedTypeCheck) ||
       (BVar8 = IR::Instr::GetBailOutKind(&branchInstr_local->super_Instr),
       BVar8 == BailOutFailedFixedFieldTypeCheck)) {
      iVar1._0_2_ = bailOutInstr->m_opcode;
      iVar1._2_1_ = bailOutInstr->ignoreOverflowBitCount;
      iVar1._3_1_ = bailOutInstr->dataWidth;
      if (iVar1 == -1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar13 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x3795,"(bailOutInfo->polymorphicCacheIndex != (uint)-1)",
                           "bailOutInfo->polymorphicCacheIndex != (uint)-1");
        if (!bVar6) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar13 = 0;
      }
      if (bailOutInstr->m_next == (Instr *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar13 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x3796,"(bailOutInfo->bailOutRecord)","bailOutInfo->bailOutRecord");
        if (!bVar6) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar13 = 0;
      }
      polymorphicCacheIndexValue._0_2_ = bailOutInstr->m_opcode;
      polymorphicCacheIndexValue._2_1_ = bailOutInstr->ignoreOverflowBitCount;
      polymorphicCacheIndexValue._3_1_ = bailOutInstr->dataWidth;
      InsertMoveForPolymorphicCacheIndex
                (this,&branchInstr_local->super_Instr,(BailOutInfo *)bailOutInstr,
                 functionBodyOpnd._4_4_,polymorphicCacheIndexValue);
    }
    bVar6 = BailOutRecord::IsShared((BailOutRecord *)bailOutInstr->m_next);
    if (bVar6) {
      BVar8 = IR::Instr::GetBailOutKind(&branchInstr_local->super_Instr);
      if ((BVar8 != BailOutFailedTypeCheck) &&
         (BVar8 = IR::Instr::GetBailOutKind(&branchInstr_local->super_Instr),
         BVar8 != BailOutFailedFixedFieldTypeCheck)) {
        InsertMoveForPolymorphicCacheIndex
                  (this,&branchInstr_local->super_Instr,(BailOutInfo *)bailOutInstr,
                   functionBodyOpnd._4_4_,0xffffffff);
      }
      bVar6 = Func::IsOOPJIT(this->m_func);
      if (bVar6) {
        pFVar14 = Func::GetTopFunc(this->m_func);
        pSVar15 = Func::GetNativeCodeDataSym(pFVar14);
        pRVar16 = IR::RegOpnd::New(pSVar15,TyVar,this->m_func);
        uVar4 = functionBodyOpnd._4_4_;
        sVar11 = SharedBailOutRecord::GetOffsetOfFunctionBody();
        bailOutTargetLabel =
             (LabelInstr *)
             IR::IndirOpnd::New(pRVar16,uVar4 + (int)sVar11,TyUint64,this->m_func,false);
      }
      else {
        pIVar2 = bailOutInstr->m_next;
        sVar11 = SharedBailOutRecord::GetOffsetOfFunctionBody();
        bailOutTargetLabel =
             (LabelInstr *)
             IR::MemRefOpnd::New((void *)((long)&pIVar2->_vptr_Instr + sVar11),TyUint64,this->m_func
                                 ,AddrOpndKindDynamicMisc);
      }
      pLVar20 = bailOutTargetLabel;
      src = CreateFunctionBodyOpnd(this,(branchInstr_local->super_Instr).m_func);
      InsertMove((Opnd *)pLVar20,&src->super_Opnd,&branchInstr_local->super_Instr,false);
    }
    newBranchInstr = (BranchInstr *)IR::Instr::AsLabelInstr(&bailOutLabelInstr->super_Instr);
    if (((byte)((LabelInstr *)newBranchInstr)->field_0x78 >> 5 & 1) != 0) {
      *(byte *)&bailOutInfo->liveFloat64Syms = *(byte *)&bailOutInfo->liveFloat64Syms & 0xdf | 0x20;
    }
    if ((collectRuntimeStatsLabel_local != (LabelInstr *)0x0) &&
       (collectRuntimeStatsLabel_local != (LabelInstr *)newBranchInstr)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar13 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x37ba,"(bailOutLabel == nullptr || bailOutLabel == bailOutTargetLabel)",
                         "bailOutLabel == nullptr || bailOutLabel == bailOutTargetLabel");
      if (!bVar6) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar13 = 0;
    }
    pBStack_90 = IR::BranchInstr::New(JMP,(LabelInstr *)newBranchInstr,this->m_func);
    IR::Instr::InsertAfter(&branchInstr_local->super_Instr,&pBStack_90->super_Instr);
    IR::Instr::Remove(&branchInstr_local->super_Instr);
    if (bailOutInfo == (BailOutInfo *)0x0) {
      local_1e0 = (BailOutInfo *)collectRuntimeStatsLabel_local;
    }
    else {
      local_1e0 = bailOutInfo;
    }
    return (LabelInstr *)local_1e0;
  }
  local_10 = bailOutLabelInstr;
  IVar7 = IR::Instr::GetKind(&bailOutLabelInstr->super_Instr);
  local_1e1 = true;
  if (IVar7 != InstrKindLabel) {
    local_1e1 = IR::Instr::IsProfiledLabelInstr(&pLVar20->super_Instr);
  }
  if (local_1e1 != false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar13 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x37c3,"(!bailOutInstr->IsLabelInstr())","!bailOutInstr->IsLabelInstr()");
    if (!bVar6) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar13 = 0;
  }
  if (collectRuntimeStatsLabel_local == (LabelInstr *)0x0) {
    pIVar2 = (branchInstr_local->super_Instr).m_prev;
    local_18 = pIVar2;
    IVar7 = IR::Instr::GetKind(pIVar2);
    local_1f1 = true;
    if (IVar7 != InstrKindLabel) {
      local_1f1 = IR::Instr::IsProfiledLabelInstr(pIVar2);
    }
    if (local_1f1 == false) {
      collectRuntimeStatsLabel_local = IR::LabelInstr::New(Label,this->m_func,true);
      IR::Instr::InsertBefore
                (&branchInstr_local->super_Instr,&collectRuntimeStatsLabel_local->super_Instr);
    }
    else {
      collectRuntimeStatsLabel_local =
           IR::Instr::AsLabelInstr((branchInstr_local->super_Instr).m_prev);
      if (((byte)collectRuntimeStatsLabel_local->field_0x78 >> 1 & 1) == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar13 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x37cc,"(bailOutLabel->isOpHelper)","bailOutLabel->isOpHelper");
        if (!bVar6) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar13 = 0;
      }
    }
  }
  else {
    IR::Instr::InsertBefore
              (&branchInstr_local->super_Instr,&collectRuntimeStatsLabel_local->super_Instr);
  }
  (collectRuntimeStatsLabel_local->super_Instr).m_noLazyHelperAssert = true;
  BVar8 = IR::Instr::GetBailOutKind(&bailOutLabelInstr->super_Instr);
  bailOutRecord._4_4_ = BVar8;
  if (((((bailOutLabelInstr->super_Instr).m_opcode != BailOnNoSimdTypeSpec) &&
       ((bailOutLabelInstr->super_Instr).m_opcode != BailOnNoProfile)) &&
      ((bailOutLabelInstr->super_Instr).m_opcode != BailOnException)) &&
     ((bailOutLabelInstr->super_Instr).m_opcode != Yield)) {
    BVar9 = IR::operator|(BailOutConventionalTypedArrayAccessOnly,
                          BailOutConventionalNativeArrayAccessOnly);
    BVar9 = IR::operator|(BVar9,BailOutOnArrayAccessHelperCall);
    BVar8 = IR::operator&(BVar8,BVar9);
    if (BVar8 == BailOutInvalid) goto LAB_00798098;
  }
  collectRuntimeStatsLabel_local->field_0x78 =
       collectRuntimeStatsLabel_local->field_0x78 & 0xdf | 0x20;
LAB_00798098:
  *(LabelInstr **)&bailOutInstr[1].field_0x38 = collectRuntimeStatsLabel_local;
  collectRuntimeStatsLabel_local->field_0x78 = collectRuntimeStatsLabel_local->field_0x78 & 0xfb | 4
  ;
  if (bailOutInstr->m_next != (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar13 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x37f0,"(bailOutInfo->bailOutRecord == nullptr)",
                       "bailOutInfo->bailOutRecord == nullptr");
    if (!bVar6) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar13 = 0;
  }
  if (bailOutLabel_local == (LabelInstr *)0x0) {
    BVar8 = IR::Instr::GetBailOutKind(&bailOutLabelInstr->super_Instr);
    if (BVar8 == BailOutShared) {
      pAVar18 = Func::GetNativeCodeDataAllocator(this->m_func);
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_130,(type_info *)&SharedBailOutRecord::typeinfo,0,0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                 ,0x382b);
      pAVar18 = NativeCodeData::Allocator::TrackAllocInfo(pAVar18,&local_130);
      local_140 = NativeCodeData::AllocatorT<SharedBailOutRecord>::AllocZero;
      local_138 = 0;
      pBVar19 = (BranchBailOutRecord *)
                new<NativeCodeData::AllocatorT<SharedBailOutRecord>>
                          (0x68,(AllocatorT<SharedBailOutRecord> *)pAVar18,0x7f0360);
      uVar10 = bailOutInstr->bailOutByteCodeLocation;
      bailOutCacheIndex._0_2_ = bailOutInstr->m_opcode;
      bailOutCacheIndex._2_1_ = bailOutInstr->ignoreOverflowBitCount;
      bailOutCacheIndex._3_1_ = bailOutInstr->dataWidth;
      BVar8 = IR::Instr::GetBailOutKind(&branchInstr_local->super_Instr);
      SharedBailOutRecord::SharedBailOutRecord
                ((SharedBailOutRecord *)pBVar19,uVar10,bailOutCacheIndex,BVar8,
                 (Func *)bailOutInstr[1].m_src2);
      pBStack_a0 = pBVar19;
      if (((ulong)bailOutInstr->_vptr_Instr & 0x100000000) != 0) {
        BailOutRecord::SetType((BailOutRecord *)pBVar19,SharedForLoopTop);
      }
    }
    else {
      pAVar18 = Func::GetNativeCodeDataAllocator(this->m_func);
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_168,(type_info *)&BailOutRecord::typeinfo,0,0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                 ,0x3834);
      pAVar18 = NativeCodeData::Allocator::TrackAllocInfo(pAVar18,&local_168);
      pBVar19 = (BranchBailOutRecord *)
                new<NativeCodeData::AllocatorT<BailOutRecord>>
                          (0x60,(AllocatorT<BailOutRecord> *)pAVar18,0x775940);
      uVar10 = bailOutInstr->bailOutByteCodeLocation;
      bailOutCacheIndex_00._0_2_ = bailOutInstr->m_opcode;
      bailOutCacheIndex_00._2_1_ = bailOutInstr->ignoreOverflowBitCount;
      bailOutCacheIndex_00._3_1_ = bailOutInstr->dataWidth;
      BVar8 = IR::Instr::GetBailOutKind(&branchInstr_local->super_Instr);
      BailOutRecord::BailOutRecord
                ((BailOutRecord *)pBVar19,uVar10,bailOutCacheIndex_00,BVar8,
                 (Func *)bailOutInstr[1].m_src2);
      pBStack_a0 = pBVar19;
    }
    targetLabel._4_4_ = HelperSaveAllRegistersAndBailOut;
  }
  else {
    pOVar17 = IR::Instr::GetSrc2(&bailOutLabel_local->super_Instr);
    if (pOVar17 != (Opnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar13 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x37f5,"(branchInstr->GetSrc2() == nullptr)",
                         "branchInstr->GetSrc2() == nullptr");
      if (!bVar6) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar13 = 0;
    }
    pOVar17 = IR::Instr::GetDst(&bailOutLabel_local->super_Instr);
    if (pOVar17 != (Opnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar13 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x37f6,"(branchInstr->GetDst() == nullptr)",
                         "branchInstr->GetDst() == nullptr");
      if (!bVar6) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar13 = 0;
    }
    _falseOffset = IR::BranchInstr::GetTarget((BranchInstr *)bailOutLabel_local);
    uVar10 = IR::Instr::GetByteCodeOffset(&_falseOffset->super_Instr);
    if (uVar10 == 0xffffffff) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar13 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x37f9,
                         "(targetLabel->GetByteCodeOffset() != Js::Constants::NoByteCodeOffset)",
                         "targetLabel->GetByteCodeOffset() != Js::Constants::NoByteCodeOffset");
      if (!bVar6) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar13 = 0;
    }
    pOVar17 = IR::Instr::GetSrc1(&bailOutLabel_local->super_Instr);
    subInstr._7_1_ = (bailOutLabel_local->super_Instr).m_opcode == BrFalse_A;
    pOStack_c0 = pOVar17;
    if (((ulong)bailOutInstr->_vptr_Instr & 0x100) != 0) {
      pIVar12 = IR::IntConstOpnd::New(1,TyInt64,(branchInstr_local->super_Instr).m_func,false);
      local_d0 = IR::Instr::New(Sub_I4,pOVar17,pOVar17,&pIVar12->super_Opnd,
                                (branchInstr_local->super_Instr).m_func);
      IR::Instr::InsertBefore(&branchInstr_local->super_Instr,local_d0);
      LowererMD::EmitInt4Instr(local_d0);
      subInstr._7_1_ = (subInstr._7_1_ & 1) - 1 & 1;
    }
    if ((bool)subInstr._7_1_ == false) {
      condOpnd._4_4_ = IR::Instr::GetByteCodeOffset(&_falseOffset->super_Instr);
      condOpnd._0_4_ = bailOutInstr->bailOutByteCodeLocation;
    }
    else {
      condOpnd._0_4_ = IR::Instr::GetByteCodeOffset(&_falseOffset->super_Instr);
      condOpnd._4_4_ = bailOutInstr->bailOutByteCodeLocation;
    }
    pAVar18 = Func::GetNativeCodeDataAllocator(this->m_func);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_f8,(type_info *)&BranchBailOutRecord::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
               ,0x3819);
    pAVar18 = NativeCodeData::Allocator::TrackAllocInfo(pAVar18,&local_f8);
    local_108 = NativeCodeData::AllocatorT<BranchBailOutRecord>::AllocZero;
    local_100 = 0;
    pBVar19 = (BranchBailOutRecord *)
              new<NativeCodeData::AllocatorT<BranchBailOutRecord>>
                        (0x68,(AllocatorT<BranchBailOutRecord> *)pAVar18,0x7f0130);
    trueBailOutOffset = condOpnd._4_4_;
    uVar10 = (uint32)condOpnd;
    resultByteCodeReg = IR::BranchInstr::GetByteCodeReg((BranchInstr *)bailOutLabel_local);
    BVar8 = IR::Instr::GetBailOutKind(&branchInstr_local->super_Instr);
    BranchBailOutRecord::BranchBailOutRecord
              (pBVar19,trueBailOutOffset,uVar10,resultByteCodeReg,BVar8,
               (Func *)bailOutInstr[1].m_src2);
    targetLabel._4_4_ = HelperSaveAllRegistersAndBranchBailOut;
    pBStack_a0 = pBVar19;
    pOVar17 = IR::Instr::GetSrc1(&bailOutLabel_local->super_Instr);
    pOVar17 = IR::Opnd::Copy(pOVar17,(bailOutLabel_local->super_Instr).m_func);
    bailOutInstr[2]._vptr_Instr = (_func_int **)pOVar17;
  }
  bailOutInstr->m_next = (Instr *)pBStack_a0;
  (pBStack_a0->super_BailOutRecord).bailOutOpcode = *(OpCode *)&bailOutInstr[1].m_src1;
  if (((branchInstr_local->super_Instr).m_opcode == BailOnNotStackArgs) &&
     (pOVar17 = IR::Instr::GetSrc1(&branchInstr_local->super_Instr), pOVar17 != (Opnd *)0x0)) {
    IR::Instr::FreeSrc1(&branchInstr_local->super_Instr);
  }
  pOVar17 = IR::Instr::GetSrc2(&branchInstr_local->super_Instr);
  if (pOVar17 != (Opnd *)0x0) {
    IR::Instr::FreeSrc2(&branchInstr_local->super_Instr);
  }
  bVar6 = IR::Instr::HasLazyBailOut(&branchInstr_local->super_Instr);
  if (bVar6) {
    IR::Instr::ClearLazyBailOut(&branchInstr_local->super_Instr);
    bVar6 = IR::Instr::HasBailOutInfo(&branchInstr_local->super_Instr);
    if (!bVar6) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar13 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x3858,"(instr->HasBailOutInfo())","instr->HasBailOutInfo()");
      if (!bVar6) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar13 = 0;
    }
  }
  (branchInstr_local->super_Instr).m_opcode = Call;
  pOVar17 = IR::Instr::GetDst(&branchInstr_local->super_Instr);
  if (pOVar17 != (Opnd *)0x0) {
    IR::Instr::FreeDst(&branchInstr_local->super_Instr);
  }
  pBVar5 = branchInstr_local;
  newSrc = IR::HelperCallOpnd::New(targetLabel._4_4_,this->m_func);
  IR::Instr::SetSrc1(&pBVar5->super_Instr,&newSrc->super_Opnd);
  LowererMD::LowerCall(&this->m_lowererMD,&branchInstr_local->super_Instr,0);
  this_01 = Func::GetJITFunctionBody(this->m_func);
  bVar6 = JITTimeFunctionBody::IsCoroutine(this_01);
  pBVar5 = branchInstr_local;
  pIVar2 = bailOutInstr;
  if (bVar6) {
    BVar8 = IR::Instr::GetBailOutKind(&bailOutLabelInstr->super_Instr);
    pBVar5 = branchInstr_local;
    pIVar2 = bailOutInstr;
    if (BVar8 != BailOutForGeneratorYield) {
      pLVar20 = LowerGeneratorHelper::GetEpilogueForBailOut(&this->m_lowerGeneratorHelper);
      GenerateJumpToEpilogForBailOut(this,(BailOutInfo *)pIVar2,&pBVar5->super_Instr,pLVar20);
    }
  }
  else {
    pLVar20 = EnsureEpilogueLabel(this);
    GenerateJumpToEpilogForBailOut(this,(BailOutInfo *)pIVar2,&pBVar5->super_Instr,pLVar20);
  }
  if (bailOutInfo == (BailOutInfo *)0x0) {
    local_2a8 = (BailOutInfo *)collectRuntimeStatsLabel_local;
  }
  else {
    local_2a8 = bailOutInfo;
  }
  return (LabelInstr *)local_2a8;
}

Assistant:

IR::LabelInstr *
Lowerer::GenerateBailOut(IR::Instr * instr, IR::BranchInstr * branchInstr, IR::LabelInstr *bailOutLabel, IR::LabelInstr * collectRuntimeStatsLabel)
{
    BailOutInfo * bailOutInfo = instr->GetBailOutInfo();
    IR::Instr * bailOutInstr = bailOutInfo->bailOutInstr;
    if (instr->IsCloned())
    {
        Assert(bailOutInstr != instr);

        // Jump to the cloned bail out label
        IR::LabelInstr * bailOutLabelInstr = bailOutInstr->AsLabelInstr();
        IR::BranchInstr * bailOutBranch = IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, bailOutLabelInstr, this->m_func);
        instr->InsertBefore(bailOutBranch);
        instr->Remove();
        return bailOutLabel;
    }

    // Add helper label to trigger layout.
    if (!collectRuntimeStatsLabel)
    {
        collectRuntimeStatsLabel = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, true);
    }
    Assert(!collectRuntimeStatsLabel->IsLinked());
    instr->InsertBefore(collectRuntimeStatsLabel);

    if (bailOutInstr != instr)
    {
        // this bailOutInfo is shared, just jump to the bailout target

        IR::Opnd * indexOpndForBailOutKind = nullptr;

        int bailOutRecordOffset = 0;
        if (this->m_func->IsOOPJIT())
        {
            bailOutRecordOffset = NativeCodeData::GetDataTotalOffset(bailOutInfo->bailOutRecord);

            indexOpndForBailOutKind = IR::IndirOpnd::New(IR::RegOpnd::New(m_func->GetTopFunc()->GetNativeCodeDataSym(), TyVar, m_func), (int)(bailOutRecordOffset + BailOutRecord::GetOffsetOfBailOutKind()), TyUint32,
#if DBG
                NativeCodeData::GetDataDescription(bailOutInfo->bailOutRecord, this->m_func->m_alloc),
#endif
                m_func, true);

            this->addToLiveOnBackEdgeSyms->Set(m_func->GetTopFunc()->GetNativeCodeDataSym()->m_id);
        }
        else
        {
            indexOpndForBailOutKind =
                IR::MemRefOpnd::New((BYTE*)bailOutInfo->bailOutRecord + BailOutRecord::GetOffsetOfBailOutKind(), TyUint32, this->m_func, IR::AddrOpndKindDynamicBailOutKindRef);
        }

        InsertMove(
            indexOpndForBailOutKind, IR::IntConstOpnd::New(instr->GetBailOutKind(), indexOpndForBailOutKind->GetType(), this->m_func), instr, false);

        // No point in doing this for BailOutFailedEquivalentTypeCheck or BailOutFailedEquivalentFixedFieldTypeCheck,
        // because the respective inline cache is already polymorphic, anyway.
        if (instr->GetBailOutKind() == IR::BailOutFailedTypeCheck || instr->GetBailOutKind() == IR::BailOutFailedFixedFieldTypeCheck)
        {
            // We have a type check bailout that shares a bailout record with other instructions.
            // Generate code to write the cache index into the bailout record before we jump to the call site.
            Assert(bailOutInfo->polymorphicCacheIndex != (uint)-1);
            Assert(bailOutInfo->bailOutRecord);
            InsertMoveForPolymorphicCacheIndex(instr, bailOutInfo, bailOutRecordOffset, bailOutInfo->polymorphicCacheIndex);
        }

        if (bailOutInfo->bailOutRecord->IsShared())
        {
            // The polymorphicCacheIndex value should be relevant only for field type check bailouts.
            // In case of a shared bailout record, the polymorphicCacheIndex sticks regardless of the bailout kind being different
            // from field type check. Therefore, it results in an out-of-bound write while trying to recrod a field access update.
            if (instr->GetBailOutKind() != IR::BailOutFailedTypeCheck && instr->GetBailOutKind() != IR::BailOutFailedFixedFieldTypeCheck)
            {
                InsertMoveForPolymorphicCacheIndex(instr, bailOutInfo, bailOutRecordOffset, (uint)-1);
            }

            IR::Opnd *functionBodyOpnd;
            if (this->m_func->IsOOPJIT())
            {
                functionBodyOpnd = IR::IndirOpnd::New(IR::RegOpnd::New(m_func->GetTopFunc()->GetNativeCodeDataSym(), TyVar, m_func), (int)(bailOutRecordOffset + SharedBailOutRecord::GetOffsetOfFunctionBody()), TyMachPtr, m_func);
            }
            else
            {
                functionBodyOpnd = IR::MemRefOpnd::New((BYTE*)bailOutInfo->bailOutRecord + SharedBailOutRecord::GetOffsetOfFunctionBody(), TyMachPtr, this->m_func);
            }
            InsertMove(
                functionBodyOpnd, CreateFunctionBodyOpnd(instr->m_func), instr, false);
        }

        // GenerateBailOut should have replaced this as a label as we should have already lowered
        // the main bailOutInstr.
        IR::LabelInstr * bailOutTargetLabel = bailOutInstr->AsLabelInstr();
#if DBG
        if (bailOutTargetLabel->m_noHelperAssert)
        {
            collectRuntimeStatsLabel->m_noHelperAssert = true;
        }
#endif
        Assert(bailOutLabel == nullptr || bailOutLabel == bailOutTargetLabel);

        IR::BranchInstr * newBranchInstr = IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, bailOutTargetLabel, this->m_func);
        instr->InsertAfter(newBranchInstr);
        instr->Remove();
        return collectRuntimeStatsLabel ? collectRuntimeStatsLabel : bailOutLabel;
    }

    // The bailout hasn't been generated yet.
    Assert(!bailOutInstr->IsLabelInstr());

    // Capture the condition for this bailout
    if (bailOutLabel == nullptr)
    {
        // Create a label and place it in the bailout info so that shared bailout point can jump to this one
        if (instr->m_prev->IsLabelInstr())
        {
            bailOutLabel = instr->m_prev->AsLabelInstr();
            Assert(bailOutLabel->isOpHelper);
        }
        else
        {
            bailOutLabel = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, true);
            instr->InsertBefore(bailOutLabel);
        }
    }
    else
    {
        instr->InsertBefore(bailOutLabel);
    }

#if DBG
    bailOutLabel->m_noLazyHelperAssert = true;
#endif

#if DBG
    const IR::BailOutKind bailOutKind = bailOutInstr->GetBailOutKind();

    if (bailOutInstr->m_opcode == Js::OpCode::BailOnNoSimdTypeSpec ||
        bailOutInstr->m_opcode == Js::OpCode::BailOnNoProfile ||
        bailOutInstr->m_opcode == Js::OpCode::BailOnException ||
        bailOutInstr->m_opcode == Js::OpCode::Yield ||
        bailOutKind & (IR::BailOutConventionalTypedArrayAccessOnly |
                       IR::BailOutConventionalNativeArrayAccessOnly |
                       IR::BailOutOnArrayAccessHelperCall))
    {
        bailOutLabel->m_noHelperAssert = true;
    }
#endif

    bailOutInfo->bailOutInstr = bailOutLabel;
    bailOutLabel->m_hasNonBranchRef = true;

    // Create the bail out record
    Assert(bailOutInfo->bailOutRecord == nullptr);
    BailOutRecord * bailOutRecord;
    IR::JnHelperMethod helperMethod;
    if (branchInstr != nullptr)
    {
        Assert(branchInstr->GetSrc2() == nullptr);
        Assert(branchInstr->GetDst() == nullptr);

        IR::LabelInstr * targetLabel = branchInstr->GetTarget();
        Assert(targetLabel->GetByteCodeOffset() != Js::Constants::NoByteCodeOffset);

        uint32 trueOffset;
        uint32 falseOffset;
        IR::Opnd *condOpnd = branchInstr->GetSrc1();
        bool invertTarget = (branchInstr->m_opcode == Js::OpCode::BrFalse_A);

        if (bailOutInfo->isInvertedBranch)
        {
            // Flip the condition
            IR::Instr *subInstr = IR::Instr::New(Js::OpCode::Sub_I4, condOpnd, condOpnd, IR::IntConstOpnd::New(1, TyMachReg, instr->m_func), instr->m_func);
            instr->InsertBefore(subInstr);
            this->m_lowererMD.EmitInt4Instr(subInstr);
            // We should really do a DEC/NEG for a full 2's complement flip from 0/1 to 1/0,
            // but DEC is sufficient to flip from 0/1 to -1/0, which is false/true to true/false...
            // instr->InsertBefore(IR::Instr::New(Js::OpCode::Neg_I4, condOpnd, condOpnd, instr->m_func));

            invertTarget = invertTarget ? false : true;
        }

        if (!invertTarget)
        {
            trueOffset = targetLabel->GetByteCodeOffset();
            falseOffset = bailOutInfo->bailOutOffset;
        }
        else
        {
            falseOffset = targetLabel->GetByteCodeOffset();
            trueOffset = bailOutInfo->bailOutOffset;
        }

        bailOutRecord = NativeCodeDataNewZ(this->m_func->GetNativeCodeDataAllocator(),
            BranchBailOutRecord, trueOffset, falseOffset, branchInstr->GetByteCodeReg(), instr->GetBailOutKind(), bailOutInfo->bailOutFunc);

        helperMethod = IR::HelperSaveAllRegistersAndBranchBailOut;
#ifdef _M_IX86
        if(!AutoSystemInfo::Data.SSE2Available())
        {
            helperMethod = IR::HelperSaveAllRegistersNoSse2AndBranchBailOut;
        }
#endif

        // Save the condition. The register allocator will generate arguments.
        bailOutInfo->branchConditionOpnd = branchInstr->GetSrc1()->Copy(branchInstr->m_func);
    }
    else
    {
        if (bailOutInstr->GetBailOutKind() == IR::BailOutShared)
        {
            bailOutRecord = NativeCodeDataNewZ(this->m_func->GetNativeCodeDataAllocator(),
                SharedBailOutRecord, bailOutInfo->bailOutOffset, bailOutInfo->polymorphicCacheIndex, instr->GetBailOutKind(), bailOutInfo->bailOutFunc);
            if (bailOutInfo->isLoopTopBailOutInfo)
            {
                bailOutRecord->SetType(BailOutRecord::BailoutRecordType::SharedForLoopTop);
            }
        }
        else
        {
            bailOutRecord = NativeCodeDataNewZ(this->m_func->GetNativeCodeDataAllocator(),
                BailOutRecord, bailOutInfo->bailOutOffset, bailOutInfo->polymorphicCacheIndex, instr->GetBailOutKind(), bailOutInfo->bailOutFunc);
        }

        helperMethod = IR::HelperSaveAllRegistersAndBailOut;
#ifdef _M_IX86
        if(!AutoSystemInfo::Data.SSE2Available())
        {
            helperMethod = IR::HelperSaveAllRegistersNoSse2AndBailOut;
        }
#endif
    }

    // Save the bailout record. The register allocator will generate arguments.
    bailOutInfo->bailOutRecord = bailOutRecord;

#if ENABLE_DEBUG_CONFIG_OPTIONS
    bailOutRecord->bailOutOpcode = bailOutInfo->bailOutOpcode;
#endif

    if (instr->m_opcode == Js::OpCode::BailOnNotStackArgs && instr->GetSrc1())
    {
        // src1 on BailOnNotStackArgs is helping CSE
        instr->FreeSrc1();
    }

    if (instr->GetSrc2() != nullptr)
    {
        // Ideally we should never be in this situation but incase we reached a
        // condition where we didn't free src2, free it here.
        instr->FreeSrc2();
    }

    // We do not need lazybailout bit on SaveAllRegistersAndBailOut
    if (instr->HasLazyBailOut())
    {
        instr->ClearLazyBailOut();
        Assert(instr->HasBailOutInfo());
    }

    // Call the bail out wrapper
    instr->m_opcode = Js::OpCode::Call;
    if(instr->GetDst())
    {
        // To facilitate register allocation, don't assign a destination. The result will anyway go into the return register,
        // but the register allocator does not need to kill that register for the call.
        instr->FreeDst();
    }
    instr->SetSrc1(IR::HelperCallOpnd::New(helperMethod, this->m_func));
    m_lowererMD.LowerCall(instr, 0);

    if (this->m_func->GetJITFunctionBody()->IsCoroutine())
    {
        if (bailOutInstr->GetBailOutKind() != IR::BailOutForGeneratorYield)
        {
            // Defer introducing the JMP to epilog until LowerPrologEpilog phase for Yield bailouts so
            // that Yield does not appear to have flow out of its containing block for the RegAlloc phase.
            // Yield is an unconditional bailout but we want to simulate the flow as if the Yield were
            // just like a call.
            GenerateJumpToEpilogForBailOut(bailOutInfo, instr, this->m_lowerGeneratorHelper.GetEpilogueForBailOut());
        }
    }
    else
    {
        GenerateJumpToEpilogForBailOut(bailOutInfo, instr, this->EnsureEpilogueLabel());
    }



    return collectRuntimeStatsLabel ? collectRuntimeStatsLabel : bailOutLabel;
}